

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation.cpp
# Opt level: O0

uint32_t icu_63::Collation::decTwoBytePrimaryByOneStep
                   (uint32_t basePrimary,UBool isCompressible,int32_t step)

{
  undefined4 local_18;
  int32_t byte2;
  int32_t step_local;
  UBool isCompressible_local;
  uint32_t basePrimary_local;
  
  local_18 = (basePrimary >> 0x10 & 0xff) - step;
  step_local = basePrimary;
  if (isCompressible == '\0') {
    if (local_18 < 2) {
      local_18 = local_18 + 0xfe;
      step_local = basePrimary - 0x1000000;
    }
  }
  else if (local_18 < 4) {
    local_18 = local_18 + 0xfb;
    step_local = basePrimary - 0x1000000;
  }
  return step_local & 0xff000000U | local_18 << 0x10;
}

Assistant:

uint32_t
Collation::decTwoBytePrimaryByOneStep(uint32_t basePrimary, UBool isCompressible, int32_t step) {
    // Extract the second byte, minus the minimum byte value,
    // minus the step, modulo the number of usable byte values, plus the minimum.
    // Reserve the PRIMARY_COMPRESSION_LOW_BYTE and high byte if necessary.
    // Assume no further underflow for the first byte.
    U_ASSERT(0 < step && step <= 0x7f);
    int32_t byte2 = ((int32_t)(basePrimary >> 16) & 0xff) - step;
    if(isCompressible) {
        if(byte2 < 4) {
            byte2 += 251;
            basePrimary -= 0x1000000;
        }
    } else {
        if(byte2 < 2) {
            byte2 += 254;
            basePrimary -= 0x1000000;
        }
    }
    return (basePrimary & 0xff000000) | ((uint32_t)byte2 << 16);
}